

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool changesWhenCasefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  char16_t cVar2;
  int iVar3;
  int32_t iVar4;
  int32_t length1;
  Normalizer2 *pNVar5;
  char16_t *pcVar6;
  bool local_151;
  UChar local_108 [2];
  int32_t destLength;
  UChar dest [62];
  UChar *resultString;
  Normalizer2 *nfcNorm2;
  undefined1 local_60 [4];
  UErrorCode errorCode;
  UnicodeString nfd;
  UProperty param_2_local;
  UChar32 c_local;
  BinaryProperty *param_0_local;
  
  nfd.fUnion._48_4_ = param_3;
  nfd.fUnion._52_4_ = c;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_60);
  nfcNorm2._4_4_ = U_ZERO_ERROR;
  pNVar5 = icu_63::Normalizer2::getNFCInstance((UErrorCode *)((long)&nfcNorm2 + 4));
  UVar1 = U_FAILURE(nfcNorm2._4_4_);
  if (UVar1 != '\0') {
    param_0_local._7_1_ = false;
    goto LAB_003db166;
  }
  iVar3 = (*(pNVar5->super_UObject)._vptr_UObject[7])
                    (pNVar5,(ulong)(uint)nfd.fUnion._52_4_,local_60);
  if ((char)iVar3 == '\0') {
    if ((int)nfd.fUnion._52_4_ < 0) {
      param_0_local._7_1_ = false;
      goto LAB_003db166;
    }
  }
  else {
    iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_60);
    if (iVar4 == 1) {
      cVar2 = icu_63::UnicodeString::operator[]((UnicodeString *)local_60,0);
      nfd.fUnion._52_4_ = ZEXT24((ushort)cVar2);
    }
    else {
      iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_60);
      if (iVar4 < 3) {
        iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_60);
        nfd.fUnion._52_4_ = icu_63::UnicodeString::char32At((UnicodeString *)local_60,0);
        iVar3 = 2;
        if ((uint)nfd.fUnion._52_4_ < 0x10000) {
          iVar3 = 1;
        }
        if (iVar4 == iVar3) goto LAB_003db03a;
      }
      nfd.fUnion._52_4_ = 0xffffffff;
    }
  }
LAB_003db03a:
  if ((int)nfd.fUnion._52_4_ < 0) {
    pcVar6 = icu_63::UnicodeString::getBuffer((UnicodeString *)local_60);
    iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_60);
    iVar4 = u_strFoldCase_63(local_108,0x3e,pcVar6,iVar4,0,(UErrorCode *)((long)&nfcNorm2 + 4));
    UVar1 = U_SUCCESS(nfcNorm2._4_4_);
    local_151 = false;
    if (UVar1 != '\0') {
      pcVar6 = icu_63::UnicodeString::getBuffer((UnicodeString *)local_60);
      length1 = icu_63::UnicodeString::length((UnicodeString *)local_60);
      iVar4 = u_strCompare_63(pcVar6,length1,local_108,iVar4,'\0');
      local_151 = iVar4 != 0;
    }
    param_0_local._7_1_ = local_151;
  }
  else {
    iVar4 = ucase_toFullFolding_63(nfd.fUnion._52_4_,(UChar **)(dest + 0x3c),0);
    param_0_local._7_1_ = -1 < iVar4;
  }
LAB_003db166:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return param_0_local._7_1_;
}

Assistant:

static UBool changesWhenCasefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UnicodeString nfd;
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfcNorm2=Normalizer2::getNFCInstance(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(nfcNorm2->getDecomposition(c, nfd)) {
        /* c has a decomposition */
        if(nfd.length()==1) {
            c=nfd[0];  /* single BMP code point */
        } else if(nfd.length()<=U16_MAX_LENGTH &&
                  nfd.length()==U16_LENGTH(c=nfd.char32At(0))
        ) {
            /* single supplementary code point */
        } else {
            c=U_SENTINEL;
        }
    } else if(c<0) {
        return FALSE;  /* protect against bad input */
    }
    if(c>=0) {
        /* single code point */
        const UChar *resultString;
        return (UBool)(ucase_toFullFolding(c, &resultString, U_FOLD_CASE_DEFAULT)>=0);
    } else {
        /* guess some large but stack-friendly capacity */
        UChar dest[2*UCASE_MAX_STRING_LENGTH];
        int32_t destLength;
        destLength=u_strFoldCase(dest, UPRV_LENGTHOF(dest),
                                  nfd.getBuffer(), nfd.length(),
                                  U_FOLD_CASE_DEFAULT, &errorCode);
        return (UBool)(U_SUCCESS(errorCode) &&
                       0!=u_strCompare(nfd.getBuffer(), nfd.length(),
                                       dest, destLength, FALSE));
    }
}